

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epnp.cpp
# Opt level: O2

void __thiscall opengv::absolute_pose::modules::Epnp::Epnp(Epnp *this)

{
  undefined1 auVar1 [32];
  
  this->uc = 0.0;
  this->vc = 0.0;
  auVar1 = ZEXT432(0) << 0x40;
  this->pws = (double *)auVar1._0_8_;
  this->us = (double *)auVar1._8_8_;
  this->alphas = (double *)auVar1._16_8_;
  this->pcs = (double *)auVar1._24_8_;
  this->alphas = (double *)auVar1._0_8_;
  this->pcs = (double *)auVar1._8_8_;
  this->signs = (int *)auVar1._16_8_;
  this->maximum_number_of_correspondences = auVar1._24_4_;
  this->number_of_correspondences = auVar1._28_4_;
  this->fu = 1.0;
  this->fv = 1.0;
  return;
}

Assistant:

opengv::absolute_pose::modules::Epnp::Epnp(void)
{
  maximum_number_of_correspondences = 0;
  number_of_correspondences = 0;

  pws = 0;
  us = 0;
  alphas = 0;
  pcs = 0;
  signs = 0; //added

  this->uc = 0.0;
  this->vc = 0.0;
  this->fu = 1.0;
  this->fv = 1.0;
}